

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_SHA2.cc
# Opt level: O0

string * __thiscall Pl_SHA2::getHexDigest_abi_cxx11_(string *__return_storage_ptr__,Pl_SHA2 *this)

{
  logic_error *this_00;
  string local_48;
  Pl_SHA2 *local_18;
  Pl_SHA2 *this_local;
  
  local_18 = this;
  this_local = (Pl_SHA2 *)__return_storage_ptr__;
  if ((this->in_progress & 1U) != 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"digest requested for in-progress SHA2 Pipeline");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  getRawDigest_abi_cxx11_(&local_48,this);
  QUtil::hex_encode(__return_storage_ptr__,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string
Pl_SHA2::getHexDigest()
{
    if (this->in_progress) {
        throw std::logic_error("digest requested for in-progress SHA2 Pipeline");
    }
    return QUtil::hex_encode(getRawDigest());
}